

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederate.cpp
# Opt level: O0

Input * __thiscall
helics::ValueFederate::registerInput
          (ValueFederate *this,string_view name,string_view type,string_view units)

{
  string_view units_00;
  string_view addition;
  Input *pIVar1;
  _Alloc_hider in_stack_00000080;
  undefined1 in_stack_00000088 [16];
  string_view in_stack_00000098;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  Federate *this_01;
  size_t in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  
  this_01 = (Federate *)&stack0x00000008;
  std::unique_ptr<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
  ::operator->((unique_ptr<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
                *)0x3778b2);
  addition._M_str = in_stack_ffffffffffffff68;
  addition._M_len = in_stack_ffffffffffffff60;
  Federate::localNameGenerator_abi_cxx11_(this_01,addition);
  std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff30);
  this_00 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
             &this_01->currentMode;
  units_00._M_str = (char *)type._M_len;
  units_00._M_len = (size_t)this;
  pIVar1 = ValueFederateManager::registerInput
                     ((ValueFederateManager *)in_stack_00000080._M_p,in_stack_00000098,
                      (string_view)in_stack_00000088,units_00);
  std::__cxx11::string::~string(this_00);
  return pIVar1;
}

Assistant:

Input& ValueFederate::registerInput(std::string_view name,
                                    std::string_view type,
                                    std::string_view units)
{
    return vfManager->registerInput(localNameGenerator(name), type, units);
}